

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_NtkPrepare(Sfm_Ntk_t *p)

{
  uint uVar1;
  Sfm_Par_t *pSVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wrd_t *pVVar6;
  word *__s;
  Vec_Wec_t *pVVar7;
  sat_solver *s;
  int iVar8;
  ulong uVar9;
  
  uVar1 = (p->vLevels).nSize;
  if ((ulong)uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    piVar5 = (p->vLevels).pArray;
    iVar3 = *piVar5;
    if (1 < (int)uVar1) {
      uVar9 = 1;
      do {
        iVar8 = piVar5[uVar9];
        if (iVar3 <= iVar8) {
          iVar3 = iVar8;
        }
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  pSVar2 = p->pPars;
  p->nLevelMax = iVar3 + pSVar2->nGrowthLevel;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  p->vNodes = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p->vDivs = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  p->vRoots = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  p->vTfo = pVVar4;
  iVar3 = pSVar2->nWinSizeMax;
  pVVar6 = (Vec_Wrd_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar8 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar8 << 3);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar3;
  memset(__s,0,(long)iVar3 << 3);
  p->vDivCexes = pVVar6;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p->vOrder = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p->vDivVars = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  p->vDivIds = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p->vLits = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p->vValues = pVVar4;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(100,0x10);
  pVVar7->pArray = pVVar4;
  p->vClauses = pVVar7;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  p->vFaninMap = pVVar4;
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,p->pPars->nWinSizeMax);
  return;
}

Assistant:

void Sfm_NtkPrepare( Sfm_Ntk_t * p )
{
    p->nLevelMax = Vec_IntFindMax(&p->vLevels) + p->pPars->nGrowthLevel;
    p->vNodes    = Vec_IntAlloc( 1000 );
    p->vDivs     = Vec_IntAlloc( 100 );
    p->vRoots    = Vec_IntAlloc( 1000 );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vDivCexes = Vec_WrdStart( p->pPars->nWinSizeMax );
    p->vOrder    = Vec_IntAlloc( 100 );
    p->vDivVars  = Vec_IntAlloc( 100 );
    p->vDivIds   = Vec_IntAlloc( 1000 );
    p->vLits     = Vec_IntAlloc( 100 );
    p->vValues   = Vec_IntAlloc( 100 );
    p->vClauses  = Vec_WecAlloc( 100 );
    p->vFaninMap = Vec_IntAlloc( 10 );
    p->pSat      = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->pPars->nWinSizeMax );
}